

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O1

bool ispring::File::FileCopy(string *src,string *dst)

{
  char cVar1;
  bool bVar2;
  ofstream f2;
  ifstream f1;
  long local_410;
  filebuf local_408 [240];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(string *)src,_S_bin);
  std::ofstream::ofstream(&local_410,(string *)dst,_S_trunc|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::ostream::operator<<(&local_410,local_200);
      std::ofstream::close();
      bVar2 = true;
      std::ifstream::close();
      goto LAB_00137e45;
    }
  }
  std::ifstream::close();
  std::ofstream::close();
  bVar2 = false;
LAB_00137e45:
  local_410 = _VTT;
  *(undefined8 *)(local_408 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_408);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return bVar2;
}

Assistant:

inline bool FileCopy(std::string src, std::string dst) {
			//https://stackoverflow.com/questions/3680730/c-fileio-copy-vs-systemcp-file1-x-file2-x
			std::ifstream f1 (src, std::fstream::binary);
			std::ofstream f2 (dst, std::fstream::trunc|std::fstream::binary);
			if(f1.is_open()==false || f2.is_open()==false){
				f1.close();
				f2.close();
				return false;
			}
			f2 << f1.rdbuf ();
			f2.close();
			f1.close();
			return true;
		}